

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lcast_unsigned_converters.hpp
# Opt level: O1

bool __thiscall
boost::detail::lcast_ret_unsigned<std::char_traits<char>,_unsigned_int,_char>::convert
          (lcast_ret_unsigned<std::char_traits<char>,_unsigned_int,_char> *this)

{
  char *pcVar1;
  uint *puVar2;
  uint uVar3;
  char cVar4;
  bool bVar5;
  uint uVar6;
  locale *plVar7;
  numpunct *pnVar8;
  char *pcVar9;
  byte bVar10;
  byte bVar11;
  char cVar12;
  locale loc;
  locale local_50 [8];
  long *local_48;
  long local_40;
  long local_38 [2];
  
  puVar2 = this->m_value;
  pcVar9 = this->m_end;
  pcVar1 = pcVar9 + -1;
  this->m_end = pcVar1;
  *puVar2 = 0;
  if ((pcVar1 < this->m_begin) || ((byte)(*pcVar1 - 0x3aU) < 0xf6)) {
    bVar5 = false;
  }
  else {
    *puVar2 = (uint)(byte)(*pcVar1 - 0x30);
    this->m_end = pcVar9 + -2;
    std::locale::locale(local_50);
    plVar7 = (locale *)std::locale::classic();
    cVar4 = std::locale::operator==(local_50,plVar7);
    if (cVar4 == '\0') {
      pnVar8 = std::use_facet<std::__cxx11::numpunct<char>>(local_50);
      (**(code **)(*(long *)pnVar8 + 0x20))(&local_48,pnVar8);
      if ((local_40 == 0) || ((char)*local_48 < '\x01')) {
LAB_001a148e:
        bVar5 = main_convert_loop(this);
      }
      else {
        cVar4 = (**(code **)(*(long *)pnVar8 + 0x18))(pnVar8);
        pcVar1 = this->m_begin;
        pcVar9 = this->m_end;
        bVar5 = true;
        if (pcVar1 <= pcVar9) {
          bVar10 = this->m_multiplier_overflowed;
          cVar12 = (char)*local_48 + -1;
          puVar2 = this->m_value;
          bVar11 = 0;
          do {
            if (cVar12 != '\0') {
              bVar10 = bVar10 & 1 | 0x19999999 < this->m_multiplier;
              this->m_multiplier_overflowed = (bool)bVar10;
              uVar3 = this->m_multiplier * 10;
              this->m_multiplier = uVar3;
              if (0xf5 < (byte)(*pcVar9 - 0x3aU)) {
                uVar6 = (int)*pcVar9 - 0x30;
                if ((uVar6 == 0) ||
                   ((((bool)bVar10 == false && ((int)((ulong)uVar6 * (ulong)uVar3 >> 0x20) == 0)) &&
                    (!CARRY4(*puVar2,uVar6 * uVar3))))) {
                  *puVar2 = *puVar2 + uVar6 * uVar3;
                  cVar12 = cVar12 + -1;
                  goto LAB_001a147c;
                }
              }
LAB_001a14cc:
              bVar5 = false;
              break;
            }
            if (*pcVar9 != cVar4) goto LAB_001a148e;
            if (pcVar9 == pcVar1) goto LAB_001a14cc;
            bVar11 = bVar11 + ((ulong)bVar11 < local_40 - 1U);
            cVar12 = *(char *)((long)local_48 + (ulong)bVar11);
LAB_001a147c:
            pcVar9 = pcVar9 + -1;
            this->m_end = pcVar9;
          } while (pcVar1 <= pcVar9);
        }
      }
      if (local_48 != local_38) {
        operator_delete(local_48,local_38[0] + 1);
      }
    }
    else {
      bVar5 = main_convert_loop(this);
    }
    std::locale::~locale(local_50);
  }
  return bVar5;
}

Assistant:

inline bool convert() {
                CharT const czero = lcast_char_constants<CharT>::zero;
                --m_end;
                m_value = static_cast<T>(0);

                if (m_begin > m_end || *m_end < czero || *m_end >= czero + 10)
                    return false;
                m_value = static_cast<T>(*m_end - czero);
                --m_end;

#ifdef BOOST_LEXICAL_CAST_ASSUME_C_LOCALE
                return main_convert_loop();
#else
                std::locale loc;
                if (loc == std::locale::classic()) {
                    return main_convert_loop();
                }

                typedef std::numpunct<CharT> numpunct;
                numpunct const& np = BOOST_USE_FACET(numpunct, loc);
                std::string const& grouping = np.grouping();
                std::string::size_type const grouping_size = grouping.size();

                /* According to Programming languages - C++
                 * we MUST check for correct grouping
                 */
                if (!grouping_size || grouping[0] <= 0) {
                    return main_convert_loop();
                }

                unsigned char current_grouping = 0;
                CharT const thousands_sep = np.thousands_sep();
                char remained = static_cast<char>(grouping[current_grouping] - 1);

                for (;m_end >= m_begin; --m_end)
                {
                    if (remained) {
                        if (!main_convert_iteration()) {
                            return false;
                        }
                        --remained;
                    } else {
                        if ( !Traits::eq(*m_end, thousands_sep) ) //|| begin == end ) return false;
                        {
                            /*
                             * According to Programming languages - C++
                             * Digit grouping is checked. That is, the positions of discarded
                             * separators is examined for consistency with
                             * use_facet<numpunct<charT> >(loc ).grouping()
                             *
                             * BUT what if there is no separators at all and grouping()
                             * is not empty? Well, we have no extraced separators, so we
                             * won`t check them for consistency. This will allow us to
                             * work with "C" locale from other locales
                             */
                            return main_convert_loop();
                        } else {
                            if (m_begin == m_end) return false;
                            if (current_grouping < grouping_size - 1) ++current_grouping;
                            remained = grouping[current_grouping];
                        }
                    }
                } /*for*/

                return true;
#endif
            }